

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O1

void __thiscall cmCTestCurlOpts::cmCTestCurlOpts(cmCTestCurlOpts *this,cmCTest *ctest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  _Optional_payload_base<int> _Var5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar6;
  string *arg;
  string_view value;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view tls_version;
  string tlsVerify;
  cmList args;
  string local_a8;
  string local_88;
  string local_68;
  cmList local_48;
  
  (this->TLSVersionOpt).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  *(undefined2 *)
   &(this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool>._M_engaged = 0;
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TLSVersion","");
  cmCTest::GetCTestConfiguration(&local_88,ctest,&local_a8);
  tls_version._M_str = local_88._M_dataplus._M_p;
  tls_version._M_len = local_88._M_string_length;
  _Var5 = (_Optional_payload_base<int>)cmCurlParseTLSVersion(tls_version);
  (this->TLSVersionOpt).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"TLSVerify","");
  cmCTest::GetCTestConfiguration(&local_88,ctest,&local_a8);
  pcVar6 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    pcVar6 = extraout_RDX_00;
  }
  if ((cmValue *)local_88._M_string_length == (cmValue *)0x0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CurlOptions","");
    cmCTest::GetCTestConfiguration(&local_a8,ctest,&local_68);
    init._M_len = 1;
    init._M_array = &local_a8;
    cmList::cmList(&local_48,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    pbVar2 = local_48.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      pbVar2 = local_48.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pbVar2 != local_48.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      iVar4 = std::__cxx11::string::compare((char *)pbVar2);
      if (iVar4 == 0) {
        (this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
      }
      iVar4 = std::__cxx11::string::compare((char *)pbVar2);
      if (iVar4 == 0) {
        this->VerifyHostOff = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48.Values);
  }
  else {
    value._M_str = pcVar6;
    value._M_len = (size_t)local_88._M_dataplus._M_p;
    bVar3 = cmValue::IsOn((cmValue *)local_88._M_string_length,value);
    (this->TLSVerifyOpt).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)(bVar3 | 0x100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmCTestCurlOpts::cmCTestCurlOpts(cmCTest* ctest)
{
  this->TLSVersionOpt =
    cmCurlParseTLSVersion(ctest->GetCTestConfiguration("TLSVersion"));

  std::string tlsVerify = ctest->GetCTestConfiguration("TLSVerify");
  if (!tlsVerify.empty()) {
    this->TLSVerifyOpt = cmIsOn(tlsVerify);
  } else {
    cmList args{ ctest->GetCTestConfiguration("CurlOptions") };
    for (std::string const& arg : args) {
      if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
        this->TLSVerifyOpt = false;
      }
      if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
        this->VerifyHostOff = true;
      }
    }
  }
}